

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O1

ChShaftsElasticGear * __thiscall chrono::ChShaftsElasticGear::Clone(ChShaftsElasticGear *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChShaftsElasticGear *this_00;
  
  this_00 = (ChShaftsElasticGear *)::operator_new(0x98);
  ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  (this_00->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBase_00b48a58;
  (this_00->super_ChLoadCustomMultiple).super_ChLoadBase.jacobians =
       (this->super_ChLoadCustomMultiple).super_ChLoadBase.jacobians;
  (this_00->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_00b48bd0;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::vector(&(this_00->super_ChLoadCustomMultiple).loadables,
           &(this->super_ChLoadCustomMultiple).loadables);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&(this_00->super_ChLoadCustomMultiple).load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)&(this->super_ChLoadCustomMultiple).load_Q);
  (this_00->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_00b4cf18;
  dVar1 = this->damping;
  dVar2 = this->rest_phase;
  dVar3 = this->Ra;
  dVar4 = this->rest_phase;
  dVar5 = this->Ra;
  dVar6 = this->ratio;
  dVar7 = this->contact_force;
  this_00->stiffness = this->stiffness;
  this_00->damping = dVar1;
  this_00->rest_phase = dVar2;
  this_00->Ra = dVar3;
  this_00->rest_phase = dVar4;
  this_00->Ra = dVar5;
  this_00->ratio = dVar6;
  this_00->contact_force = dVar7;
  return this_00;
}

Assistant:

virtual ChShaftsElasticGear* Clone() const override { return new ChShaftsElasticGear(*this); }